

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extpubkey.cpp
# Opt level: O0

void __thiscall
ExtPubkey_Base58ConstructorTest_Test::TestBody(ExtPubkey_Base58ConstructorTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  AssertHelper local_730;
  Message local_728 [2];
  CfdException *anon_var_0;
  ExtPubkey local_710;
  byte local_699;
  char *pcStack_698;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  undefined1 local_688 [8];
  string privkey_xpriv;
  Message local_660;
  NetType local_658 [2];
  undefined1 local_650 [8];
  AssertionResult gtest_ar_18;
  Message local_638;
  Pubkey local_630;
  string local_618;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar_17;
  Message local_5e0;
  ByteData256 local_5d8;
  string local_5c0;
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar_16;
  Message local_588;
  uint32_t local_580;
  uint local_57c;
  undefined1 local_578 [8];
  AssertionResult gtest_ar_15;
  Message local_560;
  uint8_t local_555;
  int local_554;
  undefined1 local_550 [8];
  AssertionResult gtest_ar_14;
  Message local_538;
  string local_530;
  undefined1 local_510 [8];
  AssertionResult gtest_ar_13;
  AssertHelper local_4e0;
  Message local_4d8;
  bool local_4c9;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar__1;
  Message local_4b0;
  uint32_t local_4a4;
  long local_4a0;
  undefined1 local_498 [8];
  AssertionResult gtest_ar_12;
  Message local_480;
  uint32_t local_474;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_11;
  Message local_458;
  ByteData local_450;
  string local_438;
  undefined1 local_418 [8];
  AssertionResult gtest_ar_10;
  Message local_400;
  ByteData local_3f8;
  string local_3e0;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_340;
  Message local_338;
  Pubkey local_330;
  string local_318;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_8;
  Message local_2e0;
  ByteData256 local_2d8;
  string local_2c0;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_7;
  Message local_288;
  uint32_t local_280;
  uint local_27c;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_6;
  Message local_260;
  uint8_t local_255;
  uchar local_254 [4];
  undefined1 local_250 [8];
  AssertionResult gtest_ar_5;
  Message local_238;
  string local_230;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_1e0;
  Message local_1d8;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_;
  Message local_1b0;
  uint32_t local_1a8;
  uint local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_3;
  Message local_188;
  uint32_t local_17c;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_2;
  Message local_160;
  ByteData local_158;
  string local_140;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_1;
  Message local_108;
  ByteData local_100;
  string local_e8;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  ExtPubkey extkey;
  allocator local_31;
  undefined1 local_30 [8];
  string ext_base58;
  ExtPubkey_Base58ConstructorTest_Test *this_local;
  
  ext_base58.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::ExtPubkey::ExtPubkey((ExtPubkey *)&gtest_ar.message_,(string *)local_30);
  cfd::core::ExtPubkey::GetData(&local_100,(ExtPubkey *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_e8,&local_100);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_c8,
             "\"0488b21e000000000000000000a3fa8c983223306de0f0f65e74ebb1e98aba751633bf91d5fb56529aa5c132c102f632717d78bf73e74aa8461e2e782532abae4eed5110241025afb59ebfd3d2fd\""
             ,"extkey.GetData().GetHex().c_str()",
             "0488b21e000000000000000000a3fa8c983223306de0f0f65e74ebb1e98aba751633bf91d5fb56529aa5c132c102f632717d78bf73e74aa8461e2e782532abae4eed5110241025afb59ebfd3d2fd"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_e8);
  cfd::core::ByteData::~ByteData(&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  cfd::core::ExtPubkey::GetVersionData(&local_158,(ExtPubkey *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_140,&local_158);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_120,"\"0488b21e\"","extkey.GetVersionData().GetHex().c_str()",
             "0488b21e",pcVar2);
  std::__cxx11::string::~string((string *)&local_140);
  cfd::core::ByteData::~ByteData(&local_158);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x2e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_17c = cfd::core::ExtPubkey::GetVersion((ExtPubkey *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_178,"extpubkey_kVersionMainnetPubkey","extkey.GetVersion()",
             &extpubkey_kVersionMainnetPubkey,&local_17c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  local_1a4 = 0;
  local_1a8 = cfd::core::ExtPubkey::GetFingerprint((ExtPubkey *)&gtest_ar.message_);
  pcVar2 = (char *)0x0;
  testing::internal::EqHelper<true>::Compare<int,unsigned_int>
            (local_1a0,"0",(int *)"extkey.GetFingerprint()",&local_1a4,&local_1a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x30,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  local_1c9 = cfd::core::ExtPubkey::IsValid((ExtPubkey *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_1c8,
               (AssertionResult *)"extkey.IsValid()","false","true",pcVar2);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ExtPubkey::ToString_abi_cxx11_(&local_230,(ExtPubkey *)&gtest_ar.message_);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_210,"ext_base58.c_str()","extkey.ToString().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_230);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  local_254[0] = '\0';
  local_254[1] = '\0';
  local_254[2] = '\0';
  local_254[3] = '\0';
  local_255 = cfd::core::ExtPubkey::GetDepth((ExtPubkey *)&gtest_ar.message_);
  testing::internal::EqHelper<true>::Compare<int,unsigned_char>
            (local_250,"0",(int *)"extkey.GetDepth()",local_254,&local_255);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  local_27c = 0;
  local_280 = cfd::core::ExtPubkey::GetChildNum((ExtPubkey *)&gtest_ar.message_);
  pcVar2 = (char *)0x0;
  testing::internal::EqHelper<true>::Compare<int,unsigned_int>
            (local_278,"0",(int *)"extkey.GetChildNum()",&local_27c,&local_280);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x34,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  cfd::core::ExtPubkey::GetChainCode(&local_2d8,(ExtPubkey *)&gtest_ar.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_2c0,&local_2d8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2a0,
             "\"a3fa8c983223306de0f0f65e74ebb1e98aba751633bf91d5fb56529aa5c132c1\"",
             "extkey.GetChainCode().GetHex().c_str()",
             "a3fa8c983223306de0f0f65e74ebb1e98aba751633bf91d5fb56529aa5c132c1",pcVar3);
  std::__cxx11::string::~string((string *)&local_2c0);
  cfd::core::ByteData256::~ByteData256(&local_2d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x35,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  cfd::core::ExtPubkey::GetPubkey(&local_330,(ExtPubkey *)&gtest_ar.message_);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_318,&local_330);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2f8,
             "\"02f632717d78bf73e74aa8461e2e782532abae4eed5110241025afb59ebfd3d2fd\"",
             "extkey.GetPubkey().GetHex().c_str()",
             "02f632717d78bf73e74aa8461e2e782532abae4eed5110241025afb59ebfd3d2fd",pcVar3);
  std::__cxx11::string::~string((string *)&local_318);
  cfd::core::Pubkey::~Pubkey(&local_330);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x36,pcVar3);
    testing::internal::AssertHelper::operator=(&local_340,&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_340);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  std::__cxx11::string::operator=
            ((string *)local_30,
             "tpubDBwZbsX7C1m4tfHxHSFBvvuasqMxzMvSNM5yuAWz6kAfCATAgegvrtGdnxkqfr8wwRZi5d9fJHXqE8EFTSogTXd3xVx3GUFy9Xcg8dufREz"
            );
  cfd::core::ExtPubkey::ExtPubkey((ExtPubkey *)&gtest_ar_9.message_,(string *)local_30);
  cfd::core::ExtPubkey::operator=((ExtPubkey *)&gtest_ar.message_,(ExtPubkey *)&gtest_ar_9.message_)
  ;
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)&gtest_ar_9.message_);
  cfd::core::ExtPubkey::GetData(&local_3f8,(ExtPubkey *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_3e0,&local_3f8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3c0,
             "\"043587cf02f4a831a200000000bdc76da475a6fbdc4f3758939ab2096d4ab53b7d66c0eed66fc0f4be242835fc030061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c0\""
             ,"extkey.GetData().GetHex().c_str()",
             "043587cf02f4a831a200000000bdc76da475a6fbdc4f3758939ab2096d4ab53b7d66c0eed66fc0f4be242835fc030061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c0"
             ,pcVar3);
  std::__cxx11::string::~string((string *)&local_3e0);
  cfd::core::ByteData::~ByteData(&local_3f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x3a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_400);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  cfd::core::ExtPubkey::GetVersionData(&local_450,(ExtPubkey *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_438,&local_450);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_418,"\"043587cf\"","extkey.GetVersionData().GetHex().c_str()",
             "043587cf",pcVar3);
  std::__cxx11::string::~string((string *)&local_438);
  cfd::core::ByteData::~ByteData(&local_450);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    testing::Message::Message(&local_458);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x3b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_458);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_458);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  local_474 = cfd::core::ExtPubkey::GetVersion((ExtPubkey *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_470,"extpubkey_kVersionTestnetPubkey","extkey.GetVersion()",
             &extpubkey_kVersionTestnetPubkey,&local_474);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
  if (!bVar1) {
    testing::Message::Message(&local_480);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_470);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x3c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_480);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
  local_4a0 = 0xa231a8f4;
  local_4a4 = cfd::core::ExtPubkey::GetFingerprint((ExtPubkey *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<long,unsigned_int>
            ((EqHelper<false> *)local_498,"2721163508","extkey.GetFingerprint()",&local_4a0,
             &local_4a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
  if (!bVar1) {
    testing::Message::Message(&local_4b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_498);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x3d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_4b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_4b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
  local_4c9 = cfd::core::ExtPubkey::IsValid((ExtPubkey *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4c8,&local_4c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c8);
  if (!bVar1) {
    testing::Message::Message(&local_4d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_13.message_,(internal *)local_4c8,
               (AssertionResult *)"extkey.IsValid()","false","true",pcVar2);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4e0,&local_4d8);
    testing::internal::AssertHelper::~AssertHelper(&local_4e0);
    std::__cxx11::string::~string((string *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_4d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ExtPubkey::ToString_abi_cxx11_(&local_530,(ExtPubkey *)&gtest_ar.message_);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_510,"ext_base58.c_str()","extkey.ToString().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_530);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_510);
  if (!bVar1) {
    testing::Message::Message(&local_538);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_510);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_538);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_538);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_510);
  local_554 = 2;
  local_555 = cfd::core::ExtPubkey::GetDepth((ExtPubkey *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<int,unsigned_char>
            ((EqHelper<false> *)local_550,"2","extkey.GetDepth()",&local_554,&local_555);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
  if (!bVar1) {
    testing::Message::Message(&local_560);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_550);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_560);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_560);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
  local_57c = 0;
  local_580 = cfd::core::ExtPubkey::GetChildNum((ExtPubkey *)&gtest_ar.message_);
  testing::internal::EqHelper<true>::Compare<int,unsigned_int>
            (local_578,"0",(int *)"extkey.GetChildNum()",&local_57c,&local_580);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_578);
  if (!bVar1) {
    testing::Message::Message(&local_588);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_578);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_588);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_588);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
  cfd::core::ExtPubkey::GetChainCode(&local_5d8,(ExtPubkey *)&gtest_ar.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_5c0,&local_5d8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_5a0,
             "\"bdc76da475a6fbdc4f3758939ab2096d4ab53b7d66c0eed66fc0f4be242835fc\"",
             "extkey.GetChainCode().GetHex().c_str()",
             "bdc76da475a6fbdc4f3758939ab2096d4ab53b7d66c0eed66fc0f4be242835fc",pcVar2);
  std::__cxx11::string::~string((string *)&local_5c0);
  cfd::core::ByteData256::~ByteData256(&local_5d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a0);
  if (!bVar1) {
    testing::Message::Message(&local_5e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_5e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a0);
  cfd::core::ExtPubkey::GetPubkey(&local_630,(ExtPubkey *)&gtest_ar.message_);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_618,&local_630);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_5f8,
             "\"030061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c0\"",
             "extkey.GetPubkey().GetHex().c_str()",
             "030061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c0",pcVar2);
  std::__cxx11::string::~string((string *)&local_618);
  cfd::core::Pubkey::~Pubkey(&local_630);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar1) {
    testing::Message::Message(&local_638);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_638);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_638);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  local_658[1] = 1;
  local_658[0] = cfd::core::ExtPubkey::GetNetworkType((ExtPubkey *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_650,"NetType::kTestnet","extkey.GetNetworkType()",
             local_658 + 1,local_658);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_650);
  if (!bVar1) {
    testing::Message::Message(&local_660);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_650);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&privkey_xpriv.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&privkey_xpriv.field_2 + 8),&local_660);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&privkey_xpriv.field_2 + 8));
    testing::Message::~Message(&local_660);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_650);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_688,
             "tprv8ZgxMBicQKsPeWHBt7a68nPnvgTnuDhUgDWC8wZCgA8GahrQ3f3uWpq7wE7Uc1dLBnCe1hhCZ886K6ND37memRDWqsA9HgSKDXtwh2Qxo6J"
             ,(allocator *)((long)&gtest_msg.value + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff968,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff968);
  if (bVar1) {
    local_699 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ExtPubkey::ExtPubkey(&local_710,(string *)local_688);
      cfd::core::ExtPubkey::operator=((ExtPubkey *)&gtest_ar.message_,&local_710);
      cfd::core::ExtPubkey::~ExtPubkey(&local_710);
    }
    if ((local_699 & 1) != 0) goto LAB_002e41a3;
    pcStack_698 = 
    "Expected: (extkey = ExtPubkey(privkey_xpriv)) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_728);
  testing::internal::AssertHelper::AssertHelper
            (&local_730,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
             ,0x47,pcStack_698);
  testing::internal::AssertHelper::operator=(&local_730,local_728);
  testing::internal::AssertHelper::~AssertHelper(&local_730);
  testing::Message::~Message(local_728);
LAB_002e41a3:
  std::__cxx11::string::~string((string *)local_688);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(ExtPubkey, Base58ConstructorTest) {
  std::string ext_base58 = "xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy";
  ExtPubkey extkey = ExtPubkey(ext_base58);

  EXPECT_STREQ("0488b21e000000000000000000a3fa8c983223306de0f0f65e74ebb1e98aba751633bf91d5fb56529aa5c132c102f632717d78bf73e74aa8461e2e782532abae4eed5110241025afb59ebfd3d2fd", extkey.GetData().GetHex().c_str());
  EXPECT_STREQ("0488b21e", extkey.GetVersionData().GetHex().c_str());
  EXPECT_EQ(extpubkey_kVersionMainnetPubkey, extkey.GetVersion());
  EXPECT_EQ(0, extkey.GetFingerprint());
  EXPECT_TRUE(extkey.IsValid());
  EXPECT_STREQ(ext_base58.c_str(), extkey.ToString().c_str());
  EXPECT_EQ(0, extkey.GetDepth());
  EXPECT_EQ(0, extkey.GetChildNum());
  EXPECT_STREQ("a3fa8c983223306de0f0f65e74ebb1e98aba751633bf91d5fb56529aa5c132c1", extkey.GetChainCode().GetHex().c_str());
  EXPECT_STREQ("02f632717d78bf73e74aa8461e2e782532abae4eed5110241025afb59ebfd3d2fd", extkey.GetPubkey().GetHex().c_str());

  ext_base58 = "tpubDBwZbsX7C1m4tfHxHSFBvvuasqMxzMvSNM5yuAWz6kAfCATAgegvrtGdnxkqfr8wwRZi5d9fJHXqE8EFTSogTXd3xVx3GUFy9Xcg8dufREz";
  extkey = ExtPubkey(ext_base58);
  EXPECT_STREQ("043587cf02f4a831a200000000bdc76da475a6fbdc4f3758939ab2096d4ab53b7d66c0eed66fc0f4be242835fc030061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c0", extkey.GetData().GetHex().c_str());
  EXPECT_STREQ("043587cf", extkey.GetVersionData().GetHex().c_str());
  EXPECT_EQ(extpubkey_kVersionTestnetPubkey, extkey.GetVersion());
  EXPECT_EQ(2721163508, extkey.GetFingerprint());
  EXPECT_TRUE(extkey.IsValid());
  EXPECT_STREQ(ext_base58.c_str(), extkey.ToString().c_str());
  EXPECT_EQ(2, extkey.GetDepth());
  EXPECT_EQ(0, extkey.GetChildNum());
  EXPECT_STREQ("bdc76da475a6fbdc4f3758939ab2096d4ab53b7d66c0eed66fc0f4be242835fc", extkey.GetChainCode().GetHex().c_str());
  EXPECT_STREQ("030061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c0", extkey.GetPubkey().GetHex().c_str());
  EXPECT_EQ(NetType::kTestnet, extkey.GetNetworkType());

  std::string privkey_xpriv = "tprv8ZgxMBicQKsPeWHBt7a68nPnvgTnuDhUgDWC8wZCgA8GahrQ3f3uWpq7wE7Uc1dLBnCe1hhCZ886K6ND37memRDWqsA9HgSKDXtwh2Qxo6J";
  EXPECT_THROW((extkey = ExtPubkey(privkey_xpriv)), CfdException);
}